

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeAddedConstants.cpp
# Opt level: O3

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::OptimizeAddedConstants::create(OptimizeAddedConstants *this)

{
  undefined1 uVar1;
  _func_int **pp_Var2;
  long in_RSI;
  
  pp_Var2 = (_func_int **)operator_new(0x1a0);
  uVar1 = *(undefined1 *)(in_RSI + 0x130);
  pp_Var2[1] = (_func_int *)0x0;
  pp_Var2[2] = (_func_int *)(pp_Var2 + 4);
  pp_Var2[3] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var2 + 4) = 0;
  *(undefined1 *)(pp_Var2 + 10) = 0;
  pp_Var2[0xb] = (_func_int *)0x0;
  pp_Var2[0xc] = (_func_int *)0x0;
  pp_Var2[0x25] = (_func_int *)0x0;
  pp_Var2[0x23] = (_func_int *)0x0;
  pp_Var2[0x24] = (_func_int *)0x0;
  pp_Var2[0x21] = (_func_int *)0x0;
  pp_Var2[0x22] = (_func_int *)0x0;
  *pp_Var2 = (_func_int *)&PTR__OptimizeAddedConstants_01074278;
  *(undefined1 *)(pp_Var2 + 0x26) = uVar1;
  pp_Var2[0x27] = (_func_int *)0x0;
  *(undefined4 *)(pp_Var2 + 0x29) = 0;
  pp_Var2[0x2a] = (_func_int *)0x0;
  pp_Var2[0x2b] = (_func_int *)(pp_Var2 + 0x29);
  pp_Var2[0x2c] = (_func_int *)(pp_Var2 + 0x29);
  pp_Var2[0x2d] = (_func_int *)0x0;
  *(undefined4 *)(pp_Var2 + 0x2f) = 0;
  pp_Var2[0x30] = (_func_int *)0x0;
  pp_Var2[0x31] = (_func_int *)(pp_Var2 + 0x2f);
  pp_Var2[0x32] = (_func_int *)(pp_Var2 + 0x2f);
  pp_Var2[0x33] = (_func_int *)0x0;
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>_>
  ).super_Pass._vptr_Pass = pp_Var2;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<OptimizeAddedConstants>(propagate);
  }